

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

YV12_BUFFER_CONFIG * realloc_and_scale_source(AV1_COMP *cpi,int scaled_width,int scaled_height)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int num_planes;
  AV1_COMMON *cm;
  _Bool in_stack_00000093;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  YV12_BUFFER_CONFIG *in_stack_000000a8;
  int in_stack_000000f0;
  int in_stack_000000f8;
  aom_codec_frame_buffer_t *in_stack_00000100;
  aom_get_frame_buffer_cb_fn_t in_stack_00000108;
  void *in_stack_00000110;
  int in_stack_00000120;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffcc;
  YV12_BUFFER_CONFIG *local_8;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  if ((in_ESI == *(int *)(*(long *)(in_RDI + 0x427b8) + 0x10)) &&
     (in_EDX == *(int *)(*(long *)(in_RDI + 0x427b8) + 0x18))) {
    local_8 = *(YV12_BUFFER_CONFIG **)(in_RDI + 0x427b8);
  }
  else {
    uVar4 = 0;
    uVar2 = (uint)(*(byte *)(in_RDI + 0x9d704) & 1);
    uVar5 = 0;
    iVar3 = aom_realloc_frame_buffer
                      (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
                       in_stack_00000098,in_stack_00000094,in_stack_000000f0,in_stack_000000f8,
                       in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000093,
                       in_stack_00000120);
    if (iVar3 != 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                         "Failed to reallocate scaled source buffer");
    }
    _Var1 = av1_resize_and_extend_frame_nonnormative
                      ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffcc,uVar5),
                       (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),
                       (int)((ulong)uVar4 >> 0x20),(int)uVar4);
    if (!_Var1) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                         "Failed to reallocate buffers during resize");
    }
    local_8 = (YV12_BUFFER_CONFIG *)(in_RDI + 0x427c0);
  }
  return local_8;
}

Assistant:

static inline YV12_BUFFER_CONFIG *realloc_and_scale_source(AV1_COMP *cpi,
                                                           int scaled_width,
                                                           int scaled_height) {
  AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);

  if (scaled_width == cpi->unscaled_source->y_crop_width &&
      scaled_height == cpi->unscaled_source->y_crop_height) {
    return cpi->unscaled_source;
  }

  if (aom_realloc_frame_buffer(
          &cpi->scaled_source, scaled_width, scaled_height,
          cm->seq_params->subsampling_x, cm->seq_params->subsampling_y,
          cm->seq_params->use_highbitdepth, AOM_BORDER_IN_PIXELS,
          cm->features.byte_alignment, NULL, NULL, NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to reallocate scaled source buffer");
  assert(cpi->scaled_source.y_crop_width == scaled_width);
  assert(cpi->scaled_source.y_crop_height == scaled_height);
  if (!av1_resize_and_extend_frame_nonnormative(
          cpi->unscaled_source, &cpi->scaled_source,
          (int)cm->seq_params->bit_depth, num_planes))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to reallocate buffers during resize");
  return &cpi->scaled_source;
}